

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

size_t duckdb_zstd::ZSTD_compressBlock_internal
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame)

{
  uint uVar1;
  int iVar2;
  BYTE *code;
  size_t code_00;
  ZSTD_entropyCTables_t *in_RCX;
  size_t in_RDX;
  ZSTD_CCtx_params *in_RSI;
  ZSTD_CCtx *in_RDI;
  seqStore_t *in_R8;
  int in_R9D;
  size_t err_code_1;
  size_t err_code;
  size_t bss;
  BYTE *op;
  BYTE *ip;
  size_t cSize;
  U32 rleMaxLength;
  size_t in_stack_00000098;
  void *in_stack_000000a0;
  ZSTD_CCtx *in_stack_000000a8;
  BYTE *src_00;
  ZSTD_entropyCTables_t *in_stack_ffffffffffffffc0;
  BYTE *code_01;
  undefined4 uVar3;
  ZSTD_entropyCTables_t *seqCollector;
  ZSTD_CCtx_params *entropyWorkspace;
  int in_stack_fffffffffffffff8;
  
  uVar3 = 0x19;
  seqCollector = in_RCX;
  entropyWorkspace = in_RSI;
  code = (BYTE *)ZSTD_buildSeqStore(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  src_00 = code;
  uVar1 = ERR_isError((size_t)code);
  if (uVar1 == 0) {
    if (src_00 == (BYTE *)0x1) {
      if ((in_RDI->seqCollector).collectSequences != 0) {
        return 0xffffffffffffff96;
      }
      code_01 = (BYTE *)0x0;
    }
    else {
      if ((in_RDI->seqCollector).collectSequences != 0) {
        ZSTD_getSeqStore(in_RDI);
        code_00 = ZSTD_copyBlockSequences
                            ((SeqCollector *)seqCollector,in_R8,(U32 *)CONCAT44(in_R9D,uVar3));
        uVar1 = ERR_isError(code_00);
        if (uVar1 != 0) {
          return code_00;
        }
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&in_RDI->blockState);
        return 0;
      }
      code_01 = (BYTE *)ZSTD_entropyCompressSeqStore
                                  ((seqStore_t *)CONCAT44(in_R9D,uVar3),in_stack_ffffffffffffffc0,
                                   in_RCX,in_RSI,src_00,(size_t)code,in_RDX,entropyWorkspace,
                                   (size_t)in_RDI,in_stack_fffffffffffffff8);
      if ((((in_R9D != 0) && (in_RDI->isFirstBlock == 0)) && (code_01 < (BYTE *)0x19)) &&
         (iVar2 = ZSTD_isRLE(src_00,(size_t)code), iVar2 != 0)) {
        code_01 = (BYTE *)0x1;
        *(char *)&in_RSI->format = (char)(in_RCX->huf).CTable[0];
      }
    }
    uVar1 = ERR_isError((size_t)code_01);
    if ((uVar1 == 0) && ((BYTE *)0x1 < code_01)) {
      ZSTD_blockState_confirmRepcodesAndEntropyTables(&in_RDI->blockState);
    }
    code = code_01;
    if ((((in_RDI->blockState).prevCBlock)->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
      (((in_RDI->blockState).prevCBlock)->entropy).fse.offcode_repeatMode = FSE_repeat_check;
    }
  }
  return (size_t)code;
}

Assistant:

static size_t
ZSTD_compressBlock_internal(ZSTD_CCtx* zc,
                            void* dst, size_t dstCapacity,
                            const void* src, size_t srcSize, U32 frame)
{
    /* This is an estimated upper bound for the length of an rle block.
     * This isn't the actual upper bound.
     * Finding the real threshold needs further investigation.
     */
    const U32 rleMaxLength = 25;
    size_t cSize;
    const BYTE* ip = (const BYTE*)src;
    BYTE* op = (BYTE*)dst;
    DEBUGLOG(5, "ZSTD_compressBlock_internal (dstCapacity=%u, dictLimit=%u, nextToUpdate=%u)",
                (unsigned)dstCapacity, (unsigned)zc->blockState.matchState.window.dictLimit,
                (unsigned)zc->blockState.matchState.nextToUpdate);

    {   const size_t bss = ZSTD_buildSeqStore(zc, src, srcSize);
        FORWARD_IF_ERROR(bss, "ZSTD_buildSeqStore failed");
        if (bss == ZSTDbss_noCompress) {
            RETURN_ERROR_IF(zc->seqCollector.collectSequences, sequenceProducer_failed, "Uncompressible block");
            cSize = 0;
            goto out;
        }
    }

    if (zc->seqCollector.collectSequences) {
        FORWARD_IF_ERROR(ZSTD_copyBlockSequences(&zc->seqCollector, ZSTD_getSeqStore(zc), zc->blockState.prevCBlock->rep), "copyBlockSequences failed");
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
        return 0;
    }

    /* encode sequences and literals */
    cSize = ZSTD_entropyCompressSeqStore(&zc->seqStore,
            &zc->blockState.prevCBlock->entropy, &zc->blockState.nextCBlock->entropy,
            &zc->appliedParams,
            dst, dstCapacity,
            srcSize,
            zc->entropyWorkspace, ENTROPY_WORKSPACE_SIZE /* statically allocated in resetCCtx */,
            zc->bmi2);

    if (frame &&
        /* We don't want to emit our first block as a RLE even if it qualifies because
         * doing so will cause the decoder (cli only) to throw a "should consume all input error."
         * This is only an issue for zstd <= v1.4.3
         */
        !zc->isFirstBlock &&
        cSize < rleMaxLength &&
        ZSTD_isRLE(ip, srcSize))
    {
        cSize = 1;
        op[0] = ip[0];
    }

out:
    if (!ZSTD_isError(cSize) && cSize > 1) {
        ZSTD_blockState_confirmRepcodesAndEntropyTables(&zc->blockState);
    }
    /* We check that dictionaries have offset codes available for the first
     * block. After the first block, the offcode table might not have large
     * enough codes to represent the offsets in the data.
     */
    if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
        zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;

    return cSize;
}